

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * __thiscall
google::(anonymous_namespace)::PrettyDuration_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          duration<int,_std::ratio<1L,_1L>_> *secs)

{
  rep_conflict rVar1;
  rep_conflict rVar2;
  _Setw _Var3;
  ostream *poVar4;
  int s;
  int hours;
  long lStack_1a0;
  int mins;
  stringstream result;
  undefined1 local_190 [376];
  _anonymous_namespace_ *local_18;
  duration<int,_std::ratio<1L,_1L>_> *secs_local;
  
  local_18 = this;
  secs_local = (duration<int,_std::ratio<1L,_1L>_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
  rVar1 = std::chrono::duration<int,_std::ratio<1L,_1L>_>::count
                    ((duration<int,_std::ratio<1L,_1L>_> *)local_18);
  rVar2 = std::chrono::duration<int,_std::ratio<1L,_1L>_>::count
                    ((duration<int,_std::ratio<1L,_1L>_> *)local_18);
  std::ios::fill((char)&stack0xfffffffffffffe60 + (char)*(undefined8 *)(lStack_1a0 + -0x18));
  poVar4 = (ostream *)std::ostream::operator<<(local_190,(rVar1 / 0x3c) / 0x3c);
  poVar4 = std::operator<<(poVar4,':');
  _Var3 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(rVar1 / 0x3c) % 0x3c);
  poVar4 = std::operator<<(poVar4,':');
  _Var3 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var3);
  std::ostream::operator<<(poVar4,rVar2 % 0x3c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe60);
  return __return_storage_ptr__;
}

Assistant:

string PrettyDuration(const std::chrono::duration<int>& secs) {
  std::stringstream result;
  int mins = secs.count() / 60;
  int hours = mins / 60;
  mins = mins % 60;
  int s = secs.count() % 60;
  result.fill('0');
  result << hours << ':' << setw(2) << mins << ':' << setw(2) << s;
  return result.str();
}